

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::PrimitiveColumnWriter::Write
          (PrimitiveColumnWriter *this,ColumnWriterState *state_p,Vector *vector,idx_t count)

{
  reference pvVar1;
  type pMVar2;
  idx_t iVar3;
  InternalException *this_00;
  long lVar4;
  ulong uVar5;
  allocator local_69;
  PrimitiveColumnWriter *local_68;
  Vector *local_60;
  pointer *local_58;
  string local_50;
  
  local_58 = &state_p[1].repetition_levels.
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  lVar4 = 0;
  local_68 = this;
  local_60 = vector;
  while( true ) {
    if (count == 0) {
      return;
    }
    pvVar1 = vector<duckdb::PageWriteInformation,_true>::get<true>
                       ((vector<duckdb::PageWriteInformation,_true> *)local_58,
                        *(long *)&state_p[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                  _M_offset - 1);
    if ((pvVar1->temp_writer).
        super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
        super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
        super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl == (MemoryStream *)0x0)
    break;
    pMVar2 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
             operator*(&pvVar1->temp_writer);
    uVar5 = pvVar1->max_write_count - pvVar1->write_count;
    if (count < uVar5) {
      uVar5 = count;
    }
    (*(local_68->super_ColumnWriter)._vptr_ColumnWriter[0xf])
              (local_68,pMVar2,
               state_p[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p,
               (pvVar1->page_state).
               super_unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
               .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl,local_60,
               lVar4,lVar4 + uVar5);
    iVar3 = pvVar1->write_count + uVar5;
    pvVar1->write_count = iVar3;
    if (iVar3 == pvVar1->max_write_count) {
      NextPage(local_68,(PrimitiveColumnWriterState *)state_p);
    }
    count = count - uVar5;
    lVar4 = lVar4 + uVar5;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_50,"Writes are not correctly aligned!?",&local_69)
  ;
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PrimitiveColumnWriter::Write(ColumnWriterState &state_p, Vector &vector, idx_t count) {
	auto &state = state_p.Cast<PrimitiveColumnWriterState>();

	idx_t remaining = count;
	idx_t offset = 0;
	while (remaining > 0) {
		auto &write_info = state.write_info[state.current_page - 1];
		if (!write_info.temp_writer) {
			throw InternalException("Writes are not correctly aligned!?");
		}
		auto &temp_writer = *write_info.temp_writer;
		idx_t write_count = MinValue<idx_t>(remaining, write_info.max_write_count - write_info.write_count);
		D_ASSERT(write_count > 0);

		WriteVector(temp_writer, state.stats_state.get(), write_info.page_state.get(), vector, offset,
		            offset + write_count);

		write_info.write_count += write_count;
		if (write_info.write_count == write_info.max_write_count) {
			NextPage(state);
		}
		offset += write_count;
		remaining -= write_count;
	}
}